

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bms_bms.cpp
# Opt level: O0

double __thiscall BmsBms::GetBaseBPM(BmsBms *this)

{
  bool bVar1;
  BmsHeaderTable *pBVar2;
  BmsHeader *this_00;
  InvalidFormatAsBpmHeaderException *this_01;
  double dVar3;
  allocator local_71;
  string local_70 [55];
  allocator local_39;
  string local_38 [32];
  double local_18;
  double bpm;
  BmsBms *this_local;
  
  local_18 = 120.0;
  bpm = (double)this;
  pBVar2 = GetHeaders(this);
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_38,"BPM",&local_39);
  bVar1 = BmsHeaderTable::IsExists(pBVar2,(string *)local_38);
  std::__cxx11::string::~string(local_38);
  std::allocator<char>::~allocator((allocator<char> *)&local_39);
  if (bVar1) {
    pBVar2 = GetHeaders(this);
    std::allocator<char>::allocator();
    std::__cxx11::string::string(local_70,"BPM",&local_71);
    this_00 = BmsHeaderTable::operator[](pBVar2,(string *)local_70);
    dVar3 = BmsHeader::ToFloat(this_00);
    local_18 = dVar3;
    std::__cxx11::string::~string(local_70);
    std::allocator<char>::~allocator((allocator<char> *)&local_71);
    if ((dVar3 == 0.0) && (!NAN(dVar3))) {
      this_01 = (InvalidFormatAsBpmHeaderException *)__cxa_allocate_exception(8);
      InvalidFormatAsBpmHeaderException::InvalidFormatAsBpmHeaderException(this_01);
      __cxa_throw(this_01,&InvalidFormatAsBpmHeaderException::typeinfo,0);
    }
  }
  return local_18;
}

Assistant:

double 
BmsBms::GetBaseBPM() {
	double bpm = BmsConst::BMS_BASIC_BPM;
	if (this->GetHeaders().IsExists("BPM")) {
		if ((bpm = this->GetHeaders()["BPM"].ToFloat()) == 0.0) {
			throw InvalidFormatAsBpmHeaderException();
		}
	}
	return bpm;
}